

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
duckdb::ParquetReader::ReadStatistics
          (ClientContext *context,ParquetOptions *parquet_options,
          shared_ptr<duckdb::ParquetFileMetadataCache,_true> *metadata,string *name)

{
  ParquetReader reader;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> local_218;
  ParquetOptions local_208;
  ParquetReader local_1c8;
  
  ParquetOptions::ParquetOptions(&local_208,(ParquetOptions *)metadata);
  local_218.internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(name->_M_dataplus)._M_p;
  local_218.internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name->_M_string_length;
  name->_M_string_length = 0;
  (name->_M_dataplus)._M_p = (pointer)0x0;
  ParquetReader(&local_1c8,(ClientContext *)parquet_options,&local_208,&local_218);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_218.internal.
              super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ParquetOptions::~ParquetOptions(&local_208);
  ReadStatistics((ParquetReader *)context,(string *)&local_1c8);
  ~ParquetReader(&local_1c8);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)context;
}

Assistant:

unique_ptr<BaseStatistics> ParquetReader::ReadStatistics(ClientContext &context, ParquetOptions parquet_options,
                                                         shared_ptr<ParquetFileMetadataCache> metadata,
                                                         const string &name) {
	ParquetReader reader(context, std::move(parquet_options), std::move(metadata));
	return reader.ReadStatistics(name);
}